

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ReadStg(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_58;
  uint local_54;
  int fVerbose;
  int kHot;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *FileName;
  FILE *pFile;
  Gia_Man_t *pAig;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_54 = 1;
  local_58 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Kvh");
      if (iVar1 == -1) {
        if (argc - globalUtilOptind != 1) {
          Abc_Print(-1,"There is no file name.\n");
          return 1;
        }
        pcVar2 = argv[globalUtilOptind];
        __stream = fopen(pcVar2,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar2);
          return 1;
        }
        fclose(__stream);
        pNew = Gia_ManStgRead(pcVar2,local_54,local_58);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      if (iVar1 == 0x4b) break;
      if (iVar1 != 0x76) goto LAB_00247ac5;
      local_58 = local_58 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    local_54 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (((int)local_54 < 1) || (5 < (int)local_54)) goto LAB_00247ac5;
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
LAB_00247ac5:
  Abc_Print(-2,"usage: &read_stg [-K <num>] [-vh] <file>\n");
  Abc_Print(-2,"\t         reads STG file and generates K-hot-encoded AIG\n");
  Abc_Print(-2,
            "\t-K num : the K parameter for hotness of the encoding (1 <= K <= 5) [default = %d]\n",
            (ulong)local_54);
  pcVar2 = "no";
  if (local_58 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles printing state codes [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : the file name\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9ReadStg( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pAig;
    FILE * pFile;
    char * FileName, ** pArgvNew;
    int c, nArgcNew;
    int kHot = 1;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            kHot = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( kHot < 1 || kHot > 5 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        return 1;
    }
    fclose( pFile );

    pAig = Gia_ManStgRead( FileName, kHot, fVerbose );
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &read_stg [-K <num>] [-vh] <file>\n" );
    Abc_Print( -2, "\t         reads STG file and generates K-hot-encoded AIG\n" );
    Abc_Print( -2, "\t-K num : the K parameter for hotness of the encoding (1 <= K <= 5) [default = %d]\n", kHot );
    Abc_Print( -2, "\t-v     : toggles printing state codes [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}